

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

QNetworkCacheMetaData __thiscall
QNetworkReplyHttpImplPrivate::fetchCacheMetaData
          (QNetworkReplyHttpImplPrivate *this,QNetworkCacheMetaData *oldMetaData)

{
  undefined1 auVar1 [16];
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  Operation OVar5;
  qsizetype qVar6;
  enable_if_t<sizeof(char)____1,_qsizetype> eVar7;
  long lVar8;
  QNetworkCacheMetaData *in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar9;
  qsizetype *pqVar10;
  QByteArrayView *pQVar11;
  qsizetype i;
  long i_00;
  long in_FS_OFFSET;
  byte bVar12;
  QByteArrayView QVar13;
  QUtf8StringView other;
  QUtf8StringView other_00;
  QAnyStringView name;
  QUtf8StringView other_01;
  QAnyStringView name_00;
  QByteArrayView value;
  QByteArrayView value_00;
  QAnyStringView newValue;
  Data *local_f0;
  QDateTime dt;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_e0;
  QHash<QByteArray,_QByteArray> local_d0;
  QHttpHeaders newHeaders;
  QHttpHeaders cacheHeaders;
  QByteArrayView headers [3];
  QByteArrayView local_88 [5];
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&this->super_QNetworkReplyPrivate = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::QNetworkCacheMetaData((QNetworkCacheMetaData *)this,in_RDX);
  cacheHeaders.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)&cacheHeaders);
  newHeaders.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&newHeaders);
  i_00 = 0;
  while( true ) {
    qVar6 = QHttpHeaders::size(&newHeaders);
    if (qVar6 <= i_00) break;
    aStack_e0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)&DAT_aaaaaaaaaaaaaaaa;
    _dt = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    _dt = QHttpHeaders::nameAt(&newHeaders,i_00);
    QVar13 = QHttpHeaders::valueAt(&newHeaders,i_00);
    aVar9 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar13.m_data;
    pqVar10 = &DAT_002ce4c0;
    pQVar11 = headers;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pQVar11->m_size = *pqVar10;
      pqVar10 = pqVar10 + (ulong)bVar12 * -2 + 1;
      pQVar11 = (QByteArrayView *)&pQVar11[-(ulong)bVar12].m_data;
    }
    bVar3 = std::any_of<QByteArrayView_const*,caseInsensitiveCompare(QByteArrayView)::__0>
                      (headers,(QByteArrayView *)&local_38,(anon_class_16_1_a8c68091_for__M_pred)_dt
                      );
    if (!bVar3) {
      eVar7 = QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])"set-cookie");
      other.m_size = eVar7;
      other.m_data = "set-cookie";
      iVar4 = QLatin1String::compare((QLatin1String *)&dt,other,CaseInsensitive);
      if (iVar4 != 0) {
        eVar7 = QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])"warning");
        other_00.m_size = eVar7;
        other_00.m_data = "warning";
        iVar4 = QLatin1String::compare((QLatin1String *)&dt,other_00,CaseInsensitive);
        if ((((QVar13.m_size != 3 || iVar4 != 0) || (*aVar9.m_data_utf8 != '1')) ||
            (9 < (int)*(char *)((long)aVar9.m_data + 1) - 0x30U)) ||
           (9 < (int)*(char *)((long)aVar9.m_data + 2) - 0x30U)) {
          name.m_size = (ulong)_dt | 0x4000000000000000;
          name.field_0.m_data = aStack_e0.m_data;
          bVar3 = QHttpHeaders::contains(&cacheHeaders,name);
          if (bVar3) {
            headers[0].m_size = 0x10;
            headers[0].m_data = "content-encoding";
            headers[1].m_size = 0xd;
            headers[1].m_data = "content-range";
            headers[2].m_size = 0xc;
            headers[2].m_data = "content-type";
            bVar3 = std::any_of<QByteArrayView_const*,caseInsensitiveCompare(QByteArrayView)::__0>
                              (headers,local_88,(anon_class_16_1_a8c68091_for__M_pred)_dt);
            if (bVar3) goto LAB_00200f45;
          }
          if (*(int *)&oldMetaData[0x4b].d.d.ptr == 0x130) {
            eVar7 = QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])"content-length");
            other_01.m_size = eVar7;
            other_01.m_data = "content-length";
            iVar4 = QLatin1String::compare((QLatin1String *)&dt,other_01,CaseInsensitive);
            if (iVar4 == 0) goto LAB_00200f45;
          }
          name_00.m_size = (ulong)_dt | 0x4000000000000000;
          name_00.field_0.m_data = aStack_e0.m_data;
          newValue.m_size = QVar13.m_size;
          newValue.field_0.m_data_utf8 = (char *)aVar9.m_data;
          QHttpHeaders::replaceOrAppend(&cacheHeaders,name_00,newValue);
        }
      }
    }
LAB_00200f45:
    i_00 = i_00 + 1;
  }
  QNetworkCacheMetaData::setHeaders((QNetworkCacheMetaData *)this,&cacheHeaders);
  local_d0.d = (Data *)0x0;
  QVar13 = QHttpHeaders::value(&cacheHeaders,CacheControl,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
    QVar13.m_data = (storage_type *)QVar13.m_size;
    QVar13.m_size = (qsizetype)headers;
    parseHttpOptionHeader(QVar13);
    QHash<QByteArray,_QByteArray>::operator=(&local_d0,(QHash<QByteArray,_QByteArray> *)headers);
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)headers);
    headers[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    headers[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    headers[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____ba((QByteArray *)&dt,"max-age",7);
    QHash<QByteArray,_QByteArray>::value((QByteArray *)headers,&local_d0,(QByteArray *)&dt);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dt);
    if (headers[1].m_size != 0) {
      _dt = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::currentDateTimeUtc();
      QByteArray::toInt((bool *)headers,0);
      QDateTime::addSecs((longlong)&local_f0);
      pDVar2 = _dt;
      _dt = local_f0;
      local_f0 = pDVar2;
      QDateTime::~QDateTime((QDateTime *)&local_f0);
      QNetworkCacheMetaData::setExpirationDate((QNetworkCacheMetaData *)this,&dt);
      QDateTime::~QDateTime(&dt);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)headers);
      goto LAB_002010a9;
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)headers);
  }
  QVar13 = QHttpHeaders::value(&cacheHeaders,Expires,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
    headers[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    value.m_data = (storage_type *)QVar13.m_size;
    value.m_size = (qsizetype)headers;
    QNetworkHeadersPrivate::fromHttpDate(value);
    QNetworkCacheMetaData::setExpirationDate((QNetworkCacheMetaData *)this,(QDateTime *)headers);
    QDateTime::~QDateTime((QDateTime *)headers);
  }
LAB_002010a9:
  QVar13 = QHttpHeaders::value(&cacheHeaders,LastModified,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
    value_00.m_data = (storage_type *)QVar13.m_size;
    value_00.m_size = (qsizetype)headers;
    QNetworkHeadersPrivate::fromHttpDate(value_00);
    QNetworkCacheMetaData::setLastModified((QNetworkCacheMetaData *)this,(QDateTime *)headers);
    QDateTime::~QDateTime((QDateTime *)headers);
  }
  OVar5 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
  if (OVar5 == Get) {
    Qt::Literals::StringLiterals::operator____ba((QByteArray *)headers,"no-store",8);
    bVar3 = QHash<QByteArray,_QByteArray>::contains(&local_d0,(QByteArray *)headers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)headers);
    bVar3 = !bVar3;
  }
  else {
    OVar5 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
    if (OVar5 == Post) {
      Qt::Literals::StringLiterals::operator____ba((QByteArray *)headers,"max-age",7);
      bVar3 = QHash<QByteArray,_QByteArray>::contains(&local_d0,(QByteArray *)headers);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)headers);
    }
    else {
      bVar3 = false;
    }
  }
  QNetworkCacheMetaData::setSaveToDisk((QNetworkCacheMetaData *)this,bVar3);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = aStack_e0;
  _dt = (QLatin1StringView)(auVar1 << 0x40);
  iVar4 = *(int *)&oldMetaData[0x4b].d.d.ptr;
  if (iVar4 == 0x130) {
    QNetworkCacheMetaData::attributes(in_RDX);
    QHash<QNetworkRequest::Attribute,_QVariant>::operator=
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)&dt,
               (QHash<QNetworkRequest::Attribute,_QVariant> *)headers);
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)headers);
  }
  else {
    local_f0 = (Data *)((ulong)local_f0 & 0xffffffff00000000);
    QVariant::QVariant((QVariant *)headers,iVar4);
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&dt,(Attribute *)&local_f0,
               (QVariant *)headers);
    QVariant::~QVariant((QVariant *)headers);
    local_f0 = (Data *)CONCAT44(local_f0._4_4_,1);
    QVariant::QVariant((QVariant *)headers,(QString *)(oldMetaData + 0x4c));
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&dt,(Attribute *)&local_f0,
               (QVariant *)headers);
    QVariant::~QVariant((QVariant *)headers);
  }
  QNetworkCacheMetaData::setAttributes((QNetworkCacheMetaData *)this,(AttributesMap *)&dt);
  QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)&dt);
  QHash<QByteArray,_QByteArray>::~QHash(&local_d0);
  QHttpHeaders::~QHttpHeaders(&newHeaders);
  QHttpHeaders::~QHttpHeaders(&cacheHeaders);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkCacheMetaData QNetworkReplyHttpImplPrivate::fetchCacheMetaData(const QNetworkCacheMetaData &oldMetaData) const
{
    Q_Q(const QNetworkReplyHttpImpl);

    QNetworkCacheMetaData metaData = oldMetaData;
    QHttpHeaders cacheHeaders = metaData.headers();

    const auto newHeaders = q->headers();
    for (qsizetype i = 0; i < newHeaders.size(); ++i) {
        const auto name = newHeaders.nameAt(i);
        const auto value = newHeaders.valueAt(i);

        if (isHopByHop(name))
            continue;

        if (name.compare("set-cookie", Qt::CaseInsensitive) == 0)
            continue;

        // for 4.6.0, we were planning to not store the date header in the
        // cached resource; through that we planned to reduce the number
        // of writes to disk when using a QNetworkDiskCache (i.e. don't
        // write to disk when only the date changes).
        // However, without the date we cannot calculate the age of the page
        // anymore.
        //if (header == "date")
            //continue;

        // Don't store Warning 1xx headers
        if (name.compare("warning", Qt::CaseInsensitive) == 0) {
            if (value.size() == 3
                && value[0] == '1'
                && isAsciiDigit(value[1])
                && isAsciiDigit(value[2]))
                continue;
        }

        if (cacheHeaders.contains(name)) {
            // Match the behavior of Firefox and assume Cache-Control: "no-transform"
            constexpr QByteArrayView headers[]=
                    {"content-encoding", "content-range", "content-type"};
            if (std::any_of(std::begin(headers), std::end(headers), caseInsensitiveCompare(name)))
                continue;
        }

        // IIS has been known to send "Content-Length: 0" on 304 responses, so
        // ignore this too
        if (statusCode == 304 && name.compare("content-length", Qt::CaseInsensitive) == 0)
            continue;

#if defined(QNETWORKACCESSHTTPBACKEND_DEBUG)
        QByteArrayView n = newHeaders.value(name);
        QByteArrayView o = cacheHeaders.value(name);
        if (n != o && name.compare("date", Qt::CaseInsensitive) != 0) {
            qDebug() << "replacing" << name;
            qDebug() << "new" << n;
            qDebug() << "old" << o;
        }
#endif
        cacheHeaders.replaceOrAppend(name, value);
    }
    metaData.setHeaders(cacheHeaders);

    bool checkExpired = true;

    QHash<QByteArray, QByteArray> cacheControl;
    auto value = cacheHeaders.value(QHttpHeaders::WellKnownHeader::CacheControl);
    if (!value.empty()) {
        cacheControl = parseHttpOptionHeader(value);
        QByteArray maxAge = cacheControl.value("max-age"_ba);
        if (!maxAge.isEmpty()) {
            checkExpired = false;
            QDateTime dt = QDateTime::currentDateTimeUtc();
            dt = dt.addSecs(maxAge.toInt());
            metaData.setExpirationDate(dt);
        }
    }
    if (checkExpired) {
        if (const auto value = cacheHeaders.value(
                    QHttpHeaders::WellKnownHeader::Expires); !value.isEmpty()) {
            QDateTime expiredDateTime = QNetworkHeadersPrivate::fromHttpDate(value);
            metaData.setExpirationDate(expiredDateTime);
        }
    }

    if (const auto value = cacheHeaders.value(
                QHttpHeaders::WellKnownHeader::LastModified); !value.isEmpty()) {
        metaData.setLastModified(QNetworkHeadersPrivate::fromHttpDate(value));
    }


    bool canDiskCache;
    // only cache GET replies by default, all other replies (POST, PUT, DELETE)
    //  are not cacheable by default (according to RFC 2616 section 9)
    if (httpRequest.operation() == QHttpNetworkRequest::Get) {

        canDiskCache = true;
        // HTTP/1.1. Check the Cache-Control header
        if (cacheControl.contains("no-store"_ba))
            canDiskCache = false;

    // responses to POST might be cacheable
    } else if (httpRequest.operation() == QHttpNetworkRequest::Post) {

        canDiskCache = false;
        // some pages contain "expires:" and "cache-control: no-cache" field,
        // so we only might cache POST requests if we get "cache-control: max-age ..."
        if (cacheControl.contains("max-age"_ba))
            canDiskCache = true;

    // responses to PUT and DELETE are not cacheable
    } else {
        canDiskCache = false;
    }

    metaData.setSaveToDisk(canDiskCache);
    QNetworkCacheMetaData::AttributesMap attributes;
    if (statusCode != 304) {
        // update the status code
        attributes.insert(QNetworkRequest::HttpStatusCodeAttribute, statusCode);
        attributes.insert(QNetworkRequest::HttpReasonPhraseAttribute, reasonPhrase);
    } else {
        // this is a redirection, keep the attributes intact
        attributes = oldMetaData.attributes();
    }
    metaData.setAttributes(attributes);
    return metaData;
}